

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O3

int rtr_mgr_add_spki_support(rtr_mgr_config *config,spki_update_fp spki_update_fp)

{
  long lVar1;
  spki_table *spki_table;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = -1;
  if (config != (rtr_mgr_config *)0x0) {
    spki_table = (spki_table *)lrtr_malloc(0x170);
    if (spki_table != (spki_table *)0x0) {
      spki_table_init(spki_table,spki_update_fp);
      config->spki_table = spki_table;
      iVar2 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_add_spki_support(struct rtr_mgr_config *config, const spki_update_fp spki_update_fp)
{
	if (config == NULL) {
		return RTR_ERROR;
	}

	/* Init spki table that we need to pass to the sockets */
	struct spki_table *spki_table = lrtr_malloc(sizeof(*spki_table));
	if (!spki_table) {
		return ASPA_ERROR;
	}

	spki_table_init(spki_table, spki_update_fp);
	config->spki_table = spki_table;

	return ASPA_SUCCESS;
}